

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

string * flatbuffers::anon_unknown_0::TypeToIntervalString<double>(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  double dVar1;
  string local_c0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  dVar1 = std::numeric_limits<double>::lowest();
  NumToString<double>(&local_90,dVar1);
  std::operator+(&local_70,"[",&local_90);
  std::operator+(&local_50,&local_70,"; ");
  dVar1 = std::numeric_limits<double>::max();
  NumToString<double>(&local_c0,dVar1);
  std::operator+(&local_30,&local_50,&local_c0);
  std::operator+(in_RDI,&local_30,"]");
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  return in_RDI;
}

Assistant:

static std::string TypeToIntervalString() {
  return "[" + NumToString((flatbuffers::numeric_limits<T>::lowest)()) + "; " +
         NumToString((flatbuffers::numeric_limits<T>::max)()) + "]";
}